

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O1

bool __thiscall cmFindCommon::ComputeIfDebugModeWanted(cmFindCommon *this)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  cmake *pcVar3;
  undefined1 uVar4;
  string local_50;
  
  bVar1 = cmMakefile::GetDebugFindPkgMode(this->Makefile);
  uVar4 = 1;
  if (!bVar1) {
    this_00 = this->Makefile;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_FIND_DEBUG_MODE","");
    bVar2 = cmMakefile::IsOn(this_00,&local_50);
    if (!bVar2) {
      pcVar3 = cmMakefile::GetCMakeInstance(this->Makefile);
      uVar4 = pcVar3->DebugFindOutput;
    }
  }
  if ((!bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (bool)uVar4;
}

Assistant:

bool cmFindCommon::ComputeIfDebugModeWanted()
{
  return this->Makefile->GetDebugFindPkgMode() ||
    this->Makefile->IsOn("CMAKE_FIND_DEBUG_MODE") ||
    this->Makefile->GetCMakeInstance()->GetDebugFindOutput();
}